

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group.c
# Opt level: O0

int ffgtam(fitsfile *gfptr,fitsfile *mfptr,int hdupos,int *status)

{
  int iVar1;
  size_t sVar2;
  size_t sVar3;
  fitsfile *in_RCX;
  fitsfile *in_RSI;
  fitsfile *in_RDI;
  bool bVar4;
  char tmp [1025];
  int parentStatus;
  fitsfile *tmpfptr;
  uchar charNull [1];
  char card [81];
  char keyword [75];
  char *tmpPtr [1];
  char *keys [6];
  char cwd [1025];
  char grootname [1025];
  char tmprootname [1025];
  char groupLocation [1025];
  char groupFileName [1025];
  char groupAccess2 [71];
  char groupAccess1 [71];
  char memberURI [4];
  char memberExtname [71];
  char memberHDUtype [71];
  char *tgrplc;
  char grplc [1025];
  char memberLocation [1025];
  char memberFileName [1025];
  char memberAccess2 [71];
  char memberAccess1 [71];
  long grpid;
  long ngroups;
  long nmembers;
  long memberID;
  long groupExtver;
  long memberExtver;
  int iomode;
  int groupIOstate;
  int memberIOstate;
  int i;
  int found;
  int nkeys;
  int useLocation;
  int hdutype;
  int grptype;
  int memberPosition;
  int uriCol;
  int locationCol;
  int positionCol;
  int extverCol;
  int extnameCol;
  int xtensionCol;
  long *in_stack_00004a30;
  LONGLONG in_stack_00004a38;
  uchar *in_stack_00004a40;
  LONGLONG in_stack_00004a48;
  undefined4 in_stack_00004a50;
  int in_stack_00004a54;
  fitsfile *in_stack_00004a58;
  undefined4 in_stack_00004a60;
  int in_stack_00004a64;
  fitsfile *in_stack_00004a68;
  LONGLONG in_stack_00004a70;
  LONGLONG in_stack_00004a78;
  int in_stack_00004a84;
  fitsfile *in_stack_00004a88;
  int *in_stack_00004aa0;
  int *in_stack_00004ab0;
  int *in_stack_00004ad0;
  int *in_stack_ffffffffffffd7a8;
  fitsfile *in_stack_ffffffffffffd7b0;
  fitsfile *in_stack_ffffffffffffd7b8;
  undefined4 in_stack_ffffffffffffd7c8;
  undefined4 in_stack_ffffffffffffd7cc;
  int *in_stack_ffffffffffffd7d0;
  int *in_stack_ffffffffffffd7d8;
  undefined7 in_stack_ffffffffffffd7e0;
  undefined1 in_stack_ffffffffffffd7e7;
  undefined1 uVar5;
  int *in_stack_ffffffffffffd7e8;
  int *in_stack_ffffffffffffd7f0;
  long *in_stack_ffffffffffffd7f8;
  char *in_stack_ffffffffffffd800;
  fitsfile *in_stack_ffffffffffffd808;
  int *in_stack_ffffffffffffd810;
  int *in_stack_ffffffffffffd818;
  int in_stack_ffffffffffffd824;
  fitsfile *in_stack_ffffffffffffd828;
  int *in_stack_ffffffffffffd838;
  long *in_stack_ffffffffffffd840;
  fitsfile *in_stack_ffffffffffffd848;
  int *in_stack_ffffffffffffd850;
  fitsfile *in_stack_ffffffffffffd858;
  int *in_stack_ffffffffffffd860;
  fitsfile *in_stack_ffffffffffffd868;
  int *in_stack_ffffffffffffd880;
  int *in_stack_ffffffffffffd888;
  int *in_stack_ffffffffffffd890;
  int *in_stack_ffffffffffffd8b8;
  int *in_stack_ffffffffffffd8c0;
  char **in_stack_ffffffffffffd8c8;
  char *in_stack_ffffffffffffd8d0;
  fitsfile *in_stack_ffffffffffffd8d8;
  int *in_stack_ffffffffffffd928;
  char *in_stack_ffffffffffffd930;
  int *in_stack_ffffffffffffd938;
  long *in_stack_ffffffffffffd940;
  fitsfile *in_stack_ffffffffffffd948;
  int *in_stack_ffffffffffffdbb0;
  char *in_stack_ffffffffffffdbb8;
  int *in_stack_ffffffffffffdbc0;
  char *in_stack_ffffffffffffdbc8;
  int in_stack_ffffffffffffdbd4;
  char *in_stack_ffffffffffffdbd8;
  int local_23fc;
  fitsfile *pfVar6;
  fitsfile *fptr;
  char *in_stack_ffffffffffffdc10;
  char *in_stack_ffffffffffffdc18;
  char local_2388 [88];
  char *local_2330;
  undefined1 local_2328 [48];
  char local_22f8 [1040];
  char local_1ee8 [1040];
  char local_1ad8 [1040];
  char local_16c8 [1040];
  char local_12b8 [728];
  int *in_stack_fffffffffffff020;
  char *in_stack_fffffffffffff028;
  char *in_stack_fffffffffffff030;
  char *in_stack_fffffffffffff038;
  char *in_stack_fffffffffffff040;
  fitsfile *in_stack_fffffffffffff048;
  int *in_stack_fffffffffffff060;
  undefined4 local_e0c;
  char local_e08 [80];
  char local_db8 [72];
  char *local_d70;
  char local_d68 [1040];
  char local_958 [1040];
  char local_548 [544];
  char *in_stack_fffffffffffffcd8;
  int in_stack_fffffffffffffce0;
  int in_stack_fffffffffffffce4;
  char *in_stack_fffffffffffffce8;
  char *in_stack_fffffffffffffcf0;
  fitsfile *in_stack_fffffffffffffcf8;
  long *in_stack_fffffffffffffd10;
  int *in_stack_fffffffffffffd18;
  char local_138 [80];
  char local_e8 [80];
  FITSfile *local_98;
  ulong local_90;
  long local_88;
  fitsfile local_80;
  undefined8 local_70;
  int local_68;
  int local_64;
  int local_60;
  int local_5c;
  int local_58;
  int local_54;
  undefined4 local_50;
  undefined4 local_4c;
  undefined1 local_48 [12];
  int local_3c;
  int local_38;
  int local_34;
  int local_30;
  int local_2c;
  fitsfile *local_28;
  fitsfile *local_18;
  fitsfile *local_10;
  
  local_48._4_4_ = 0;
  local_48._0_4_ = 0;
  local_4c = 0;
  local_50 = 0;
  local_54 = 6;
  local_70 = 0;
  local_80.Fptr = (FITSfile *)0x0;
  local_80.HDUposition = 0;
  local_80._4_4_ = 0;
  local_88 = 0;
  local_90 = 0;
  local_98 = (FITSfile *)0x0;
  local_e0c = 0x4c5255;
  local_28 = in_RCX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  memcpy(local_2328,&PTR_anon_var_dwarf_2fcfc_00289920,0x30);
  memset(&stack0xffffffffffffdc17,0,1);
  pfVar6 = (fitsfile *)0x0;
  local_23fc = 0;
  if (local_28->HDUposition != 0) {
    return local_28->HDUposition;
  }
  ffflmd(local_10,&local_68,&local_28->HDUposition);
  if (local_68 == 1) {
    fptr = local_18;
    if (local_18 == (fitsfile *)0x0) {
      iVar1 = ffreopen(in_stack_ffffffffffffd7b8,(fitsfile **)in_stack_ffffffffffffd7b0,
                       in_stack_ffffffffffffd7a8);
      local_28->HDUposition = iVar1;
      iVar1 = ffmahd(in_stack_ffffffffffffd828,in_stack_ffffffffffffd824,in_stack_ffffffffffffd818,
                     in_stack_ffffffffffffd810);
      local_28->HDUposition = iVar1;
      fptr = pfVar6;
      if (local_28->HDUposition != 0) goto LAB_001cf6d0;
    }
    iVar1 = ffgkys(in_stack_ffffffffffffd808,in_stack_ffffffffffffd800,
                   (char *)in_stack_ffffffffffffd7f8,(char *)in_stack_ffffffffffffd7f0,
                   in_stack_ffffffffffffd7e8);
    local_28->HDUposition = iVar1;
    if (local_28->HDUposition == 0xca) {
      strcpy(local_db8,"PRIMARY");
      local_28->HDUposition = 0;
    }
    prepare_keyvalue((char *)in_stack_ffffffffffffd7b0);
    iVar1 = ffgkyj(in_stack_ffffffffffffd808,in_stack_ffffffffffffd800,in_stack_ffffffffffffd7f8,
                   (char *)in_stack_ffffffffffffd7f0,in_stack_ffffffffffffd7e8);
    local_28->HDUposition = iVar1;
    if (local_28->HDUposition == 0xca) {
      local_70 = 1;
      local_28->HDUposition = 0;
    }
    iVar1 = ffgkys(in_stack_ffffffffffffd808,in_stack_ffffffffffffd800,
                   (char *)in_stack_ffffffffffffd7f8,(char *)in_stack_ffffffffffffd7f0,
                   in_stack_ffffffffffffd7e8);
    local_28->HDUposition = iVar1;
    if (local_28->HDUposition == 0xca) {
      local_e08[0] = '\0';
      local_28->HDUposition = 0;
    }
    prepare_keyvalue((char *)in_stack_ffffffffffffd7b0);
    ffghdn(fptr,(int *)(local_48 + 4));
    local_50 = 1;
    iVar1 = fits_get_url(in_stack_fffffffffffff048,in_stack_fffffffffffff040,
                         in_stack_fffffffffffff038,in_stack_fffffffffffff030,
                         in_stack_fffffffffffff028,in_stack_fffffffffffff020,
                         in_stack_fffffffffffff060);
    local_28->HDUposition = iVar1;
    sVar2 = strlen(local_548);
    if (sVar2 == 0) {
      strcpy(local_548,local_958);
      strcpy(local_e8,local_138);
    }
    iVar1 = fits_get_url(in_stack_fffffffffffff048,in_stack_fffffffffffff040,
                         in_stack_fffffffffffff038,in_stack_fffffffffffff030,
                         in_stack_fffffffffffff028,in_stack_fffffffffffff020,
                         in_stack_fffffffffffff060);
    local_28->HDUposition = iVar1;
    if (local_28->HDUposition == 0) {
      if (local_64 == 0) {
        ffpmsg((char *)0x1ce68c);
        local_28->HDUposition = 0x15d;
      }
      else {
        iVar1 = fits_strcasecmp((char *)in_stack_ffffffffffffd7b8,(char *)in_stack_ffffffffffffd7b0)
        ;
        if ((iVar1 == 0) ||
           (iVar1 = fits_strcasecmp((char *)in_stack_ffffffffffffd7b8,
                                    (char *)in_stack_ffffffffffffd7b0), iVar1 == 0)) {
          iVar1 = fits_get_cwd(in_stack_ffffffffffffdbb8,in_stack_ffffffffffffdbb0);
          local_28->HDUposition = iVar1;
          iVar1 = fits_strcasecmp((char *)in_stack_ffffffffffffd7b8,
                                  (char *)in_stack_ffffffffffffd7b0);
          if (iVar1 == 0) {
            if (local_548[0] == '/') {
              strcpy(local_958,local_548);
            }
            else {
              strcpy(local_958,local_22f8);
              in_stack_ffffffffffffd7f0 = (int *)strlen(local_958);
              sVar2 = strlen(local_548);
              if ((char *)0x400 < (char *)((long)in_stack_ffffffffffffd7f0 + sVar2 + 1)) {
                ffpmsg((char *)0x1ce79a);
                local_28->HDUposition = 0x7d;
                goto LAB_001cf6d0;
              }
              strcat(local_958,"/");
              strcat(local_958,local_548);
            }
            iVar1 = fits_clean_url((char *)in_stack_ffffffffffffd7e8,
                                   (char *)CONCAT17(in_stack_ffffffffffffd7e7,
                                                    in_stack_ffffffffffffd7e0),
                                   in_stack_ffffffffffffd7d8);
            local_28->HDUposition = iVar1;
          }
          iVar1 = fits_strcasecmp((char *)in_stack_ffffffffffffd7b8,
                                  (char *)in_stack_ffffffffffffd7b0);
          if (iVar1 == 0) {
            if (local_12b8[0] == '/') {
              strcpy(local_16c8,local_12b8);
            }
            else {
              strcpy(local_16c8,local_22f8);
              in_stack_ffffffffffffd7e8 = (int *)strlen(local_16c8);
              sVar2 = strlen(local_12b8);
              if (0x400 < (long)in_stack_ffffffffffffd7e8 + sVar2 + 1) {
                ffpmsg((char *)0x1ce89a);
                local_28->HDUposition = 0x7d;
                goto LAB_001cf6d0;
              }
              strcat(local_16c8,"/");
              strcat(local_16c8,local_12b8);
            }
            iVar1 = fits_clean_url((char *)in_stack_ffffffffffffd7e8,
                                   (char *)CONCAT17(in_stack_ffffffffffffd7e7,
                                                    in_stack_ffffffffffffd7e0),
                                   in_stack_ffffffffffffd7d8);
            local_28->HDUposition = iVar1;
          }
          iVar1 = fits_strcasecmp((char *)in_stack_ffffffffffffd7b8,
                                  (char *)in_stack_ffffffffffffd7b0);
          if ((iVar1 == 0) &&
             (iVar1 = fits_strcasecmp((char *)in_stack_ffffffffffffd7b8,
                                      (char *)in_stack_ffffffffffffd7b0), iVar1 == 0)) {
            fits_url2relurl((char *)in_stack_ffffffffffffd7e8,
                            (char *)CONCAT17(in_stack_ffffffffffffd7e7,in_stack_ffffffffffffd7e0),
                            (char *)in_stack_ffffffffffffd7d8,in_stack_ffffffffffffd7d0);
            fits_url2relurl((char *)in_stack_ffffffffffffd7e8,
                            (char *)CONCAT17(in_stack_ffffffffffffd7e7,in_stack_ffffffffffffd7e0),
                            (char *)in_stack_ffffffffffffd7d8,in_stack_ffffffffffffd7d0);
            strcpy(local_548,local_958);
            strcpy(local_12b8,local_16c8);
          }
        }
        else {
          local_22f8[0] = '\0';
        }
        iVar1 = ffgkyj(in_stack_ffffffffffffd808,in_stack_ffffffffffffd800,in_stack_ffffffffffffd7f8
                       ,(char *)in_stack_ffffffffffffd7f0,in_stack_ffffffffffffd7e8);
        local_28->HDUposition = iVar1;
        ffrtnm(in_stack_ffffffffffffdc18,in_stack_ffffffffffffdc10,&fptr->HDUposition);
        ffrtnm(in_stack_ffffffffffffdc18,in_stack_ffffffffffffdc10,&fptr->HDUposition);
        if ((fptr->Fptr != local_10->Fptr) &&
           (iVar1 = strncmp(local_1ad8,local_1ee8,0x401), iVar1 != 0)) {
          local_80.Fptr = (FITSfile *)-(long)local_80.Fptr;
        }
        iVar1 = ffgtnm(in_stack_ffffffffffffd848,in_stack_ffffffffffffd840,in_stack_ffffffffffffd838
                      );
        local_28->HDUposition = iVar1;
        pfVar6 = &local_80;
        in_stack_ffffffffffffd7b0 = local_28;
        iVar1 = ffgmf(in_stack_fffffffffffffcf8,in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8,
                      in_stack_fffffffffffffce4,in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8,
                      in_stack_fffffffffffffd10,in_stack_fffffffffffffd18);
        local_28->HDUposition = iVar1;
        if (local_28->HDUposition == 0x156) {
          local_28->HDUposition = 0;
          iVar1 = ffirow(in_stack_ffffffffffffd808,(LONGLONG)in_stack_ffffffffffffd800,
                         (LONGLONG)in_stack_ffffffffffffd7f8,in_stack_ffffffffffffd7f0);
          local_28->HDUposition = iVar1;
          local_88 = local_88 + 1;
          pfVar6 = (fitsfile *)(local_48 + 8);
          in_stack_ffffffffffffd7b0 = (fitsfile *)local_48;
          in_stack_ffffffffffffd7b8 = local_28;
          iVar1 = ffgtgc(in_stack_ffffffffffffd868,in_stack_ffffffffffffd860,
                         &in_stack_ffffffffffffd858->HDUposition,in_stack_ffffffffffffd850,
                         &in_stack_ffffffffffffd848->HDUposition,(int *)in_stack_ffffffffffffd840,
                         in_stack_ffffffffffffd880,in_stack_ffffffffffffd888,
                         in_stack_ffffffffffffd890);
          local_28->HDUposition = iVar1;
          local_2330 = local_db8;
          if (local_2c != 0) {
            pfVar6 = local_28;
            ffpcls(in_stack_00004a88,in_stack_00004a84,in_stack_00004a78,in_stack_00004a70,
                   (LONGLONG)in_stack_00004a68,
                   (char **)CONCAT44(in_stack_00004a64,in_stack_00004a60),in_stack_00004ad0);
          }
          local_2330 = local_e08;
          if (local_30 != 0) {
            sVar2 = strlen(local_e08);
            pfVar6 = local_28;
            if (sVar2 == 0) {
              ffpclb(in_stack_00004a68,in_stack_00004a64,(LONGLONG)in_stack_00004a58,
                     CONCAT44(in_stack_00004a54,in_stack_00004a50),in_stack_00004a48,
                     in_stack_00004a40,in_stack_00004ab0);
            }
            else {
              ffpcls(in_stack_00004a88,in_stack_00004a84,in_stack_00004a78,in_stack_00004a70,
                     (LONGLONG)in_stack_00004a68,
                     (char **)CONCAT44(in_stack_00004a64,in_stack_00004a60),in_stack_00004ad0);
            }
          }
          if (local_34 != 0) {
            pfVar6 = local_28;
            ffpclj(in_stack_00004a58,in_stack_00004a54,in_stack_00004a48,(LONGLONG)in_stack_00004a40
                   ,in_stack_00004a38,in_stack_00004a30,in_stack_00004aa0);
          }
          if (local_38 != 0) {
            pfVar6 = local_28;
            ffpclk(in_stack_00004a58,in_stack_00004a54,in_stack_00004a48,(LONGLONG)in_stack_00004a40
                   ,in_stack_00004a38,(int *)in_stack_00004a30,in_stack_00004aa0);
          }
          local_2330 = local_548;
          if (local_3c != 0) {
            ffrtnm(in_stack_ffffffffffffdc18,in_stack_ffffffffffffdc10,&fptr->HDUposition);
            ffrtnm(in_stack_ffffffffffffdc18,in_stack_ffffffffffffdc10,&fptr->HDUposition);
            if ((fptr->Fptr == local_10->Fptr) ||
               (iVar1 = strncmp(local_1ad8,local_1ee8,0x401), iVar1 == 0)) {
              pfVar6 = local_28;
              ffpclb(in_stack_00004a68,in_stack_00004a64,(LONGLONG)in_stack_00004a58,
                     CONCAT44(in_stack_00004a54,in_stack_00004a50),in_stack_00004a48,
                     in_stack_00004a40,in_stack_00004ab0);
            }
            else {
              pfVar6 = local_28;
              ffpcls(in_stack_00004a88,in_stack_00004a84,in_stack_00004a78,in_stack_00004a70,
                     (LONGLONG)in_stack_00004a68,
                     (char **)CONCAT44(in_stack_00004a64,in_stack_00004a60),in_stack_00004ad0);
            }
          }
          local_2330 = (char *)&local_e0c;
          if (local_48._8_4_ != 0) {
            ffrtnm(in_stack_ffffffffffffdc18,in_stack_ffffffffffffdc10,&fptr->HDUposition);
            ffrtnm(in_stack_ffffffffffffdc18,in_stack_ffffffffffffdc10,&fptr->HDUposition);
            if ((fptr->Fptr == local_10->Fptr) ||
               (iVar1 = strncmp(local_1ad8,local_1ee8,0x401), iVar1 == 0)) {
              pfVar6 = local_28;
              ffpclb(in_stack_00004a68,in_stack_00004a64,(LONGLONG)in_stack_00004a58,
                     CONCAT44(in_stack_00004a54,in_stack_00004a50),in_stack_00004a48,
                     in_stack_00004a40,in_stack_00004ab0);
            }
            else {
              pfVar6 = local_28;
              ffpcls(in_stack_00004a88,in_stack_00004a84,in_stack_00004a78,in_stack_00004a70,
                     (LONGLONG)in_stack_00004a68,
                     (char **)CONCAT44(in_stack_00004a64,in_stack_00004a60),in_stack_00004ad0);
            }
          }
        }
        else if (local_28->HDUposition == 0) {
          local_23fc = 0x155;
          ffpmsg((char *)0x1ceb40);
        }
        if (local_28->HDUposition == 0) {
          ffflmd(fptr,&local_68,&local_28->HDUposition);
          if ((local_60 == 0) || (local_68 != 1)) {
            ffpmsg((char *)0x1ceff3);
            ffpmsg((char *)0x1cf000);
          }
          else {
            iVar1 = ffgmng(in_stack_ffffffffffffd948,in_stack_ffffffffffffd940,
                           in_stack_ffffffffffffd938);
            local_28->HDUposition = iVar1;
            local_5c = 1;
            local_58 = 0;
            while( true ) {
              uVar5 = false;
              if (((long)local_5c <= (long)local_90) && (uVar5 = false, local_58 == 0)) {
                uVar5 = local_28->HDUposition == 0;
              }
              if ((bool)uVar5 == false) break;
              snprintf(local_2388,0x4b,"GRPID%d",local_90 & 0xffffffff);
              iVar1 = ffgkyj(in_stack_ffffffffffffd808,in_stack_ffffffffffffd800,
                             in_stack_ffffffffffffd7f8,(char *)in_stack_ffffffffffffd7f0,
                             in_stack_ffffffffffffd7e8);
              local_28->HDUposition = iVar1;
              if (local_98 == local_80.Fptr) {
                if ((long)local_98 < 0) {
                  snprintf(local_2388,0x4b,"GRPLC%d",local_90 & 0xffffffff);
                  iVar1 = ffgkls(in_stack_ffffffffffffd8d8,in_stack_ffffffffffffd8d0,
                                 in_stack_ffffffffffffd8c8,(char *)in_stack_ffffffffffffd8c0,
                                 in_stack_ffffffffffffd8b8);
                  local_28->HDUposition = iVar1;
                  if (local_28->HDUposition == 0) {
                    strcpy(local_d68,local_d70);
                    free(local_d70);
                  }
                  sVar2 = strlen(local_22f8);
                  if (sVar2 != 0) {
                    iVar1 = fits_is_url_absolute
                                      ((char *)CONCAT44(in_stack_ffffffffffffd7cc,
                                                        in_stack_ffffffffffffd7c8));
                    if ((iVar1 == 0) &&
                       (fits_path2url(in_stack_ffffffffffffdbd8,in_stack_ffffffffffffdbd4,
                                      in_stack_ffffffffffffdbc8,in_stack_ffffffffffffdbc0),
                       local_16c8[0] != '/')) {
                      strcpy(&stack0xffffffffffffd7f8,local_22f8);
                      in_stack_ffffffffffffd7d8 = (int *)strlen(&stack0xffffffffffffd7f8);
                      sVar2 = strlen(local_16c8);
                      if (0x400 < (long)in_stack_ffffffffffffd7d8 + sVar2 + 1) {
                        ffpmsg((char *)0x1cf251);
                        local_28->HDUposition = 0x7d;
                        goto LAB_001cf3c4;
                      }
                      strcat(&stack0xffffffffffffd7f8,"/");
                      strcat(&stack0xffffffffffffd7f8,local_16c8);
                      fits_clean_url((char *)in_stack_ffffffffffffd7e8,
                                     (char *)CONCAT17(uVar5,in_stack_ffffffffffffd7e0),
                                     in_stack_ffffffffffffd7d8);
                    }
                    iVar1 = fits_is_url_absolute
                                      ((char *)CONCAT44(in_stack_ffffffffffffd7cc,
                                                        in_stack_ffffffffffffd7c8));
                    if ((iVar1 == 0) &&
                       (fits_path2url(in_stack_ffffffffffffdbd8,in_stack_ffffffffffffdbd4,
                                      in_stack_ffffffffffffdbc8,in_stack_ffffffffffffdbc0),
                       local_16c8[0] != '/')) {
                      strcpy(&stack0xffffffffffffd7f8,local_22f8);
                      sVar2 = strlen(&stack0xffffffffffffd7f8);
                      sVar3 = strlen(local_16c8);
                      if (0x400 < sVar2 + sVar3 + 1) {
                        ffpmsg((char *)0x1cf33d);
                        local_28->HDUposition = 0x7d;
                        goto LAB_001cf3c4;
                      }
                      strcat(&stack0xffffffffffffd7f8,"/");
                      strcat(&stack0xffffffffffffd7f8,local_16c8);
                      fits_clean_url((char *)in_stack_ffffffffffffd7e8,
                                     (char *)CONCAT17(uVar5,in_stack_ffffffffffffd7e0),
                                     in_stack_ffffffffffffd7d8);
                    }
                  }
                  iVar1 = strcmp(local_d68,local_16c8);
                  if (iVar1 == 0) {
                    local_58 = 1;
                  }
                }
                else {
                  local_58 = 1;
                }
              }
LAB_001cf3c4:
              local_5c = local_5c + 1;
            }
            if (local_58 == 0) {
              if (local_90 == 0) {
                local_5c = 0;
                local_28->HDUposition = 0xca;
                while( true ) {
                  bVar4 = false;
                  if (local_5c < local_54) {
                    bVar4 = local_28->HDUposition == 0xca;
                  }
                  if (!bVar4) break;
                  local_28->HDUposition = 0;
                  iVar1 = ffgcrd(in_stack_ffffffffffffd8d8,in_stack_ffffffffffffd8d0,
                                 (char *)in_stack_ffffffffffffd8c8,in_stack_ffffffffffffd8c0);
                  local_28->HDUposition = iVar1;
                  local_5c = local_5c + 1;
                }
                if (local_28->HDUposition == 0xca) {
                  local_28->HDUposition = 0;
                  ffghsp(in_stack_ffffffffffffd7b8,&in_stack_ffffffffffffd7b0->HDUposition,
                         &pfVar6->HDUposition,(int *)0x1cf4f2);
                  ffgrec(in_stack_ffffffffffffd7b8,(int)((ulong)in_stack_ffffffffffffd7b0 >> 0x20),
                         (char *)pfVar6,(int *)0x1cf516);
                }
                if (local_28->HDUposition != 0) goto LAB_001cf6d0;
              }
              local_90 = local_90 + 1;
              ffrtnm(in_stack_ffffffffffffdc18,in_stack_ffffffffffffdc10,&fptr->HDUposition);
              ffrtnm(in_stack_ffffffffffffdc18,in_stack_ffffffffffffdc10,&fptr->HDUposition);
              if ((fptr->Fptr == local_10->Fptr) ||
                 (iVar1 = strncmp(local_1ad8,local_1ee8,0x401), iVar1 == 0)) {
                snprintf(local_2388,0x4b,"GRPID%d",local_90 & 0xffffffff);
                ffikyj(in_stack_ffffffffffffd868,(char *)in_stack_ffffffffffffd860,
                       (LONGLONG)in_stack_ffffffffffffd858,(char *)in_stack_ffffffffffffd850,
                       &in_stack_ffffffffffffd848->HDUposition);
              }
              else {
                snprintf(local_2388,0x4b,"GRPID%d",local_90 & 0xffffffff);
                ffikyj(in_stack_ffffffffffffd868,(char *)in_stack_ffffffffffffd860,
                       (LONGLONG)in_stack_ffffffffffffd858,(char *)in_stack_ffffffffffffd850,
                       &in_stack_ffffffffffffd848->HDUposition);
                snprintf(local_2388,0x4b,"GRPLC%d",local_90 & 0xffffffff);
                ffikls(in_stack_ffffffffffffd948,(char *)in_stack_ffffffffffffd940,
                       (char *)in_stack_ffffffffffffd938,in_stack_ffffffffffffd930,
                       in_stack_ffffffffffffd928);
                ffplsw(in_stack_ffffffffffffd858,in_stack_ffffffffffffd850);
              }
            }
            else {
              ffpmsg((char *)0x1cf3f0);
            }
          }
        }
      }
    }
  }
  else {
    ffpmsg((char *)0x1ce38e);
    local_28->HDUposition = 0x15d;
  }
LAB_001cf6d0:
  if (local_18 == (fitsfile *)0x0) {
    iVar1 = ffclos(in_stack_ffffffffffffd7b8,&in_stack_ffffffffffffd7b0->HDUposition);
    local_28->HDUposition = iVar1;
  }
  if (local_28->HDUposition != 0) {
    local_23fc = local_28->HDUposition;
  }
  local_28->HDUposition = local_23fc;
  return local_28->HDUposition;
}

Assistant:

int ffgtam(fitsfile *gfptr,   /* FITS file pointer to grouping table HDU     */
	   fitsfile *mfptr,   /* FITS file pointer to member HDU             */
	   int       hdupos,  /* member HDU position IF in the same file as
			         the grouping table AND mfptr == NULL        */
	   int      *status)  /* return status code                          */
 
/*
  add a member HDU to an existing grouping table. The fitsfile pointer gfptr
  must be positioned with the grouping table as the CHDU. The member HDU
  may either be identifed with the fitsfile *mfptr (which must be positioned
  to the member HDU) or the hdupos parameter (the HDU number of the member 
  HDU) if both reside in the same FITS file. The hdupos value is only used
  if the mfptr parameter has a value of NULL (0). The new member HDU shall 
  have the appropriate GRPIDn and GRPLCn keywords created in its header.

  Note that if the member HDU to be added to the grouping table is already
  a member of the group then it will not be added a sceond time.
*/

{
  int xtensionCol,extnameCol,extverCol,positionCol,locationCol,uriCol;
  int memberPosition = 0;
  int grptype        = 0;
  int hdutype        = 0;
  int useLocation    = 0;
  int nkeys          = 6;
  int found;
  int i;

  int memberIOstate;
  int groupIOstate;
  int iomode;

  long memberExtver = 0;
  long groupExtver  = 0;
  long memberID     = 0;
  long nmembers     = 0;
  long ngroups      = 0;
  long grpid        = 0;

  char memberAccess1[FLEN_VALUE];
  char memberAccess2[FLEN_VALUE];
  char memberFileName[FLEN_FILENAME];
  char memberLocation[FLEN_FILENAME];
  char grplc[FLEN_FILENAME];
  char *tgrplc;
  char memberHDUtype[FLEN_VALUE];
  char memberExtname[FLEN_VALUE];
  char memberURI[] = "URL";

  char groupAccess1[FLEN_VALUE];
  char groupAccess2[FLEN_VALUE];
  char groupFileName[FLEN_FILENAME];
  char groupLocation[FLEN_FILENAME];
  char tmprootname[FLEN_FILENAME], grootname[FLEN_FILENAME];
  char cwd[FLEN_FILENAME];

  char *keys[] = {"GRPNAME","EXTVER","EXTNAME","TFIELDS","GCOUNT","EXTEND"};
  char *tmpPtr[1];

  char keyword[FLEN_KEYWORD];
  char card[FLEN_CARD];

  unsigned char charNull[]  = {'\0'};

  fitsfile *tmpfptr = NULL;

  int parentStatus = 0;

  if(*status != 0) return(*status);

  do
    {
      /*
	make sure the grouping table can be modified before proceeding
      */

      fits_file_mode(gfptr,&iomode,status);

      if(iomode != READWRITE)
	{
	  ffpmsg("cannot modify grouping table (ffgtam)");
	  *status = BAD_GROUP_ATTACH;
	  continue;
	}

      /*
	 if the calling function supplied the HDU position of the member
	 HDU instead of fitsfile pointer then get a fitsfile pointer
      */

      if(mfptr == NULL)
	{
	  *status = fits_reopen_file(gfptr,&tmpfptr,status);
	  *status = fits_movabs_hdu(tmpfptr,hdupos,&hdutype,status);

	  if(*status != 0) continue;
	}
      else
	tmpfptr = mfptr;

      /*
	 determine all the information about the member HDU that will
	 be needed later; note that we establish the default values for
	 all information values that are not explicitly found
      */

      *status = fits_read_key_str(tmpfptr,"XTENSION",memberHDUtype,card,
				  status);

      if(*status == KEY_NO_EXIST) 
	{
	  strcpy(memberHDUtype,"PRIMARY");
	  *status = 0;
	}
      prepare_keyvalue(memberHDUtype);

      *status = fits_read_key_lng(tmpfptr,"EXTVER",&memberExtver,card,status);

      if(*status == KEY_NO_EXIST) 
	{
	  memberExtver = 1;
	  *status      = 0;
	}

      *status = fits_read_key_str(tmpfptr,"EXTNAME",memberExtname,card,
				  status);

      if(*status == KEY_NO_EXIST) 
	{
	  memberExtname[0] = 0;
	  *status          = 0;
	}
      prepare_keyvalue(memberExtname);

      fits_get_hdu_num(tmpfptr,&memberPosition);

      /*
	Determine if the member HDU's FITS file location needs to be
	taken into account when building its grouping table reference

	If the member location needs to be used (==> grouping table and member
	HDU reside in different files) then create an appropriate URL for
	the member HDU's file and grouping table's file. Note that the logic
	for this is rather complicated
      */

      /* SPR 3463, don't do this 
	 if(tmpfptr->Fptr == gfptr->Fptr)
	 {  */
	  /*
	    member HDU and grouping table reside in the same file, no need
	    to use the location information */
	  
      /* printf ("same file\n");
	   
	   useLocation     = 0;
	   memberIOstate   = 1;
	   *memberFileName = 0;
	}
      else
      { */ 
	  /*
	     the member HDU and grouping table FITS file location information 
	     must be used.

	     First determine the correct driver and file name for the group
	     table and member HDU files. If either are disk files then
	     construct an absolute file path for them. Finally, if both are
	     disk files construct relative file paths from the group(member)
	     file to the member(group) file.

	  */

	  /* set the USELOCATION flag to true */

	  useLocation = 1;

	  /* 
	     get the location, access type and iostate (RO, RW) of the
	     member HDU file
	  */

	  *status = fits_get_url(tmpfptr,memberFileName,memberLocation,
				 memberAccess1,memberAccess2,&memberIOstate,
				 status);

	  /*
	     if the memberFileName string is empty then use the values of
	     the memberLocation string. This corresponds to a file where
	     the "real" file is a temporary memory file, and we must assume
	     the the application really wants the original file to be the
	     group member
	   */

	  if(strlen(memberFileName) == 0)
	    {
	      strcpy(memberFileName,memberLocation);
	      strcpy(memberAccess1,memberAccess2);
	    }

	  /* 
	     get the location, access type and iostate (RO, RW) of the
	     grouping table file
	  */

	  *status = fits_get_url(gfptr,groupFileName,groupLocation,
				 groupAccess1,groupAccess2,&groupIOstate,
				 status);
	  
	  if(*status != 0) continue;

	  /*
	    the grouping table file must be writable to continue
	  */

	  if(groupIOstate == 0)
	    {
	      ffpmsg("cannot modify grouping table (ffgtam)");
	      *status = BAD_GROUP_ATTACH;
	      continue;
	    }

	  /*
	    determine how to construct the resulting URLs for the member and
	    group files
	  */

	  if(fits_strcasecmp(groupAccess1,"file://")  &&
	                                   fits_strcasecmp(memberAccess1,"file://"))
	    {
              *cwd = 0;
	      /* 
		 nothing to do in this case; both the member and group files
		 must be of an access type that already gives valid URLs;
		 i.e., URLs that we can pass directly to the file drivers
	      */
	    }
	  else
	    {
	      /*
		 retrieve the Current Working Directory as a Unix-like
		 URL standard string
	      */

	      *status = fits_get_cwd(cwd,status);

	      /*
		 create full file path for the member HDU FITS file URL
		 if it is of access type file://
	      */
	      
	      if(fits_strcasecmp(memberAccess1,"file://") == 0)
		{
		  if(*memberFileName == '/')
		    {
		      strcpy(memberLocation,memberFileName);
		    }
		  else
		    {
		      strcpy(memberLocation,cwd);
                      if (strlen(memberLocation)+strlen(memberFileName)+1 > 
                                FLEN_FILENAME-1)
                      {
                         ffpmsg("member path and filename is too long (ffgtam)");
                         *status = URL_PARSE_ERROR;
                         continue;
                      }
		      strcat(memberLocation,"/");
		      strcat(memberLocation,memberFileName);
		    }
		  
		  *status = fits_clean_url(memberLocation,memberFileName,
					   status);
		}

	      /*
		 create full file path for the grouping table HDU FITS file URL
		 if it is of access type file://
	      */

	      if(fits_strcasecmp(groupAccess1,"file://") == 0)
		{
		  if(*groupFileName == '/')
		    {
		      strcpy(groupLocation,groupFileName);
		    }
		  else
		    {
		      strcpy(groupLocation,cwd);
                      if (strlen(groupLocation)+strlen(groupFileName)+1 > 
                                FLEN_FILENAME-1)
                      {
                         ffpmsg("group path and filename is too long (ffgtam)");
                         *status = URL_PARSE_ERROR;
                         continue;
                      }
                      
		      strcat(groupLocation,"/");
		      strcat(groupLocation,groupFileName);
		    }
		  
		  *status = fits_clean_url(groupLocation,groupFileName,status);
		}

	      /*
		if both the member and group files are disk files then 
		create a relative path (relative URL) strings with 
		respect to the grouping table's file and the grouping table's 
		file with respect to the member HDU's file
	      */
	      
	      if(fits_strcasecmp(groupAccess1,"file://") == 0 &&
		                      fits_strcasecmp(memberAccess1,"file://") == 0)
		{
		  fits_url2relurl(memberFileName,groupFileName,
				                  groupLocation,status);
		  fits_url2relurl(groupFileName,memberFileName,
				                  memberLocation,status);

		  /*
		     copy the resulting partial URL strings to the
		     memberFileName and groupFileName variables for latter
		     use in the function
		   */
		    
		  strcpy(memberFileName,memberLocation);
		  strcpy(groupFileName,groupLocation);		  
		}
	    }
	  /* beo done */
	  /* }  */
      

      /* retrieve the grouping table's EXTVER value */

      *status = fits_read_key_lng(gfptr,"EXTVER",&groupExtver,card,status);

      /* 
	 if useLocation is true then make the group EXTVER value negative
	 for the subsequent GRPIDn/GRPLCn matching
      */
      /* SPR 3463 change test;  WDP added test for same filename */
      /* Now, if either the Fptr values are the same, or the root filenames
         are the same, then assume these refer to the same file.
      */
      fits_parse_rootname(tmpfptr->Fptr->filename, tmprootname, status);
      fits_parse_rootname(gfptr->Fptr->filename, grootname, status);

      if((tmpfptr->Fptr != gfptr->Fptr) && 
          strncmp(tmprootname, grootname, FLEN_FILENAME))
	   groupExtver = -1*groupExtver;

      /* retrieve the number of group members */

      *status = fits_get_num_members(gfptr,&nmembers,status);
	      
    do {

      /*
	 make sure the member HDU is not already an entry in the
	 grouping table before adding it
      */

      *status = ffgmf(gfptr,memberHDUtype,memberExtname,memberExtver,
		      memberPosition,memberFileName,&memberID,status);

      if(*status == MEMBER_NOT_FOUND) *status = 0;
      else if(*status == 0)
	{  
	  parentStatus = HDU_ALREADY_MEMBER;
    ffpmsg("Specified HDU is already a member of the Grouping table (ffgtam)");
	  continue;
	}
      else continue;

      /*
	 if the member HDU is not already recorded in the grouping table
	 then add it 
      */

      /* add a new row to the grouping table */

      *status = fits_insert_rows(gfptr,nmembers,1,status);
      ++nmembers;

      /* retrieve the grouping table column IDs and structure type */

      *status = ffgtgc(gfptr,&xtensionCol,&extnameCol,&extverCol,&positionCol,
		       &locationCol,&uriCol,&grptype,status);

      /* fill in the member HDU data in the new grouping table row */

      *tmpPtr = memberHDUtype; 

      if(xtensionCol != 0)
	fits_write_col_str(gfptr,xtensionCol,nmembers,1,1,tmpPtr,status);

      *tmpPtr = memberExtname; 

      if(extnameCol  != 0)
	{
	  if(strlen(memberExtname) != 0)
	    fits_write_col_str(gfptr,extnameCol,nmembers,1,1,tmpPtr,status);
	  else
	    /* WILL THIS WORK FOR VAR LENTH CHAR COLS??????*/
	    fits_write_col_byt(gfptr,extnameCol,nmembers,1,1,charNull,status);
	}

      if(extverCol   != 0)
	fits_write_col_lng(gfptr,extverCol,nmembers,1,1,&memberExtver,
			   status);

      if(positionCol != 0)
	fits_write_col_int(gfptr,positionCol,nmembers,1,1,
			   &memberPosition,status);

      *tmpPtr = memberFileName; 

      if(locationCol != 0)
	{
	  /* Change the test for SPR 3463 */
	  /* Now, if either the Fptr values are the same, or the root filenames
	     are the same, then assume these refer to the same file.
	  */
	  fits_parse_rootname(tmpfptr->Fptr->filename, tmprootname, status);
	  fits_parse_rootname(gfptr->Fptr->filename, grootname, status);

	  if((tmpfptr->Fptr != gfptr->Fptr) && 
	          strncmp(tmprootname, grootname, FLEN_FILENAME))
	    fits_write_col_str(gfptr,locationCol,nmembers,1,1,tmpPtr,status);
	  else
	    /* WILL THIS WORK FOR VAR LENTH CHAR COLS??????*/
	    fits_write_col_byt(gfptr,locationCol,nmembers,1,1,charNull,status);
	}

      *tmpPtr = memberURI;

      if(uriCol      != 0)
	{

	  /* Change the test for SPR 3463 */
	  /* Now, if either the Fptr values are the same, or the root filenames
	     are the same, then assume these refer to the same file.
	  */
	  fits_parse_rootname(tmpfptr->Fptr->filename, tmprootname, status);
	  fits_parse_rootname(gfptr->Fptr->filename, grootname, status);

	  if((tmpfptr->Fptr != gfptr->Fptr) && 
	          strncmp(tmprootname, grootname, FLEN_FILENAME))
	    fits_write_col_str(gfptr,uriCol,nmembers,1,1,tmpPtr,status);
	  else
	    /* WILL THIS WORK FOR VAR LENTH CHAR COLS??????*/
	    fits_write_col_byt(gfptr,uriCol,nmembers,1,1,charNull,status);
	}
    } while(0);

      if(0 != *status) continue;
      /*
	 add GRPIDn/GRPLCn keywords to the member HDU header to link
	 it to the grouing table if the they do not already exist and
	 the member file is RW
      */

      fits_file_mode(tmpfptr,&iomode,status);
 
     if(memberIOstate == 0 || iomode != READWRITE) 
	{
	  ffpmsg("cannot add GRPID/LC keywords to member HDU: (ffgtam)");
	  ffpmsg(memberFileName);
	  continue;
	}

      *status = fits_get_num_groups(tmpfptr,&ngroups,status);

      /* 
	 look for the GRPID/LC keywords in the member HDU; if the keywords
	 for the back-link to the grouping table already exist then no
	 need to add them again
       */

      for(i = 1, found = 0; i <= ngroups && !found && *status == 0; ++i)
	{
	  snprintf(keyword,FLEN_KEYWORD,"GRPID%d",(int)ngroups);
	  *status = fits_read_key_lng(tmpfptr,keyword,&grpid,card,status);

	  if(grpid == groupExtver)
	    {
	      if(grpid < 0)
		{

		  /* have to make sure the GRPLCn keyword matches too */

		  snprintf(keyword,FLEN_KEYWORD,"GRPLC%d",(int)ngroups);
		  /* SPR 1738 */
		  *status = fits_read_key_longstr(mfptr,keyword,&tgrplc,card,
						  status);
		  if (0 == *status) {
		    strcpy(grplc,tgrplc);
		    free(tgrplc);
		  }
		  
		  /*
		     always compare files using absolute paths
                     the presence of a non-empty cwd indicates
                     that the file names may require conversion
                     to absolute paths
                  */

                  if(0 < strlen(cwd)) {
                    /* temp buffer for use in assembling abs. path(s) */
                    char tmp[FLEN_FILENAME];

                    /* make grplc absolute if necessary */
                    if(!fits_is_url_absolute(grplc)) {
		      fits_path2url(grplc,FLEN_FILENAME,groupLocation,status);

		      if(groupLocation[0] != '/')
			{
			  strcpy(tmp, cwd);
                          if (strlen(tmp)+strlen(groupLocation)+1 > 
                                    FLEN_FILENAME-1)
                          {
                             ffpmsg("path and group location is too long (ffgtam)");
                             *status = URL_PARSE_ERROR;
                             continue;
                          }
			  strcat(tmp,"/");
			  strcat(tmp,groupLocation);
			  fits_clean_url(tmp,grplc,status);
			}
                    }

                    /* make groupFileName absolute if necessary */
                    if(!fits_is_url_absolute(groupFileName)) {
		      fits_path2url(groupFileName,FLEN_FILENAME,groupLocation,status);

		      if(groupLocation[0] != '/')
			{
			  strcpy(tmp, cwd);
                          if (strlen(tmp)+strlen(groupLocation)+1 > 
                                    FLEN_FILENAME-1)
                          {
                             ffpmsg("path and group location is too long (ffgtam)");
                             *status = URL_PARSE_ERROR;
                             continue;
                          }
			  strcat(tmp,"/");
			  strcat(tmp,groupLocation);
                          /*
                             note: use groupLocation (which is not used
                             below this block), to store the absolute
                             file name instead of using groupFileName.
                             The latter may be needed unaltered if the
                             GRPLC is written below
                          */

			  fits_clean_url(tmp,groupLocation,status);
			}
                    }
                  }
		  /*
		    see if the grplc value and the group file name match
		  */

		  if(strcmp(grplc,groupLocation) == 0) found = 1;
		}
	      else
		{
		  /* the match is found with GRPIDn alone */
		  found = 1;
		}
	    }
	}

      /*
	 if FOUND is true then no need to continue
      */

      if(found)
	{
	  ffpmsg("HDU already has GRPID/LC keywords for group table (ffgtam)");
	  continue;
	}

      /*
	 add the GRPID/LC keywords to the member header for this grouping
	 table
	 
	 If NGROUPS == 0 then we must position the header pointer to the
	 record where we want to insert the GRPID/LC keywords (the pointer
	 is already correctly positioned if the above search loop activiated)
      */

      if(ngroups == 0)
	{
	  /* 
	     no GRPIDn/GRPLCn keywords currently exist in header so try
	     to position the header pointer to a desirable position
	  */
	  
	  for(i = 0, *status = KEY_NO_EXIST; 
	                       i < nkeys && *status == KEY_NO_EXIST; ++i)
	    {
	      *status = 0;
	      *status = fits_read_card(tmpfptr,keys[i],card,status);
	    }
	      
	  /* all else fails: move write pointer to end of header */
	      
	  if(*status == KEY_NO_EXIST)
	    {
	      *status = 0;
	      fits_get_hdrspace(tmpfptr,&nkeys,&i,status);
	      ffgrec(tmpfptr,nkeys,card,status);
	    }
	  
	  /* any other error status then abort */
	  
	  if(*status != 0) continue;
	}
      
      /* 
	 now that the header pointer is positioned for the GRPID/LC 
	 keyword insertion increment the number of group links counter for 
	 the member HDU 
      */

      ++ngroups;

      /*
	 if the member HDU and grouping table reside in the same FITS file
	 then there is no need to add a GRPLCn keyword
      */
      /* SPR 3463 change test */
      /* Now, if either the Fptr values are the same, or the root filenames
	 are the same, then assume these refer to the same file.
      */
      fits_parse_rootname(tmpfptr->Fptr->filename, tmprootname, status);
      fits_parse_rootname(gfptr->Fptr->filename, grootname, status);

      if((tmpfptr->Fptr == gfptr->Fptr) || 
	          strncmp(tmprootname, grootname, FLEN_FILENAME) == 0)
	{
	  /* add the GRPIDn keyword only */

	  snprintf(keyword,FLEN_KEYWORD,"GRPID%d",(int)ngroups);
	  fits_insert_key_lng(tmpfptr,keyword,groupExtver,
			      "EXTVER of Group containing this HDU",status);
	}
      else 
	{
	  /* add the GRPIDn and GRPLCn keywords */

	  snprintf(keyword,FLEN_KEYWORD,"GRPID%d",(int)ngroups);
	  fits_insert_key_lng(tmpfptr,keyword,groupExtver,
			      "EXTVER of Group containing this HDU",status);

	  snprintf(keyword,FLEN_KEYWORD,"GRPLC%d",(int)ngroups);
	  /* SPR 1738 */
	  fits_insert_key_longstr(tmpfptr,keyword,groupFileName,
			      "URL of file containing Group",status);
	  fits_write_key_longwarn(tmpfptr,status);

	}

    }while(0);

  /* close the tmpfptr pointer if it was opened in this function */

  if(mfptr == NULL)
    {
      *status = fits_close_file(tmpfptr,status);
    }

  *status = 0 == *status ? parentStatus : *status;

  return(*status);
}